

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O0

bool_t rngCPUIDIsManufId(u32 *info,char *id)

{
  bool_t bVar1;
  void *in_RSI;
  long in_RDI;
  undefined1 local_11;
  
  bVar1 = memEq((void *)(in_RDI + 4),in_RSI,4);
  local_11 = false;
  if (bVar1 != 0) {
    bVar1 = memEq((void *)(in_RDI + 0xc),(void *)((long)in_RSI + 4),4);
    local_11 = false;
    if (bVar1 != 0) {
      bVar1 = memEq((void *)(in_RDI + 8),(void *)((long)in_RSI + 8),4);
      local_11 = bVar1 != 0;
    }
  }
  return (bool_t)local_11;
}

Assistant:

static bool_t rngCPUIDIsManufId(const u32 info[4], const char id[12 + 1])
{
	ASSERT(strIsValid(id));
	ASSERT(strLen(id) == 12);
	return memEq(info + 1, id + 0, 4) &&
		memEq(info + 3, id + 4, 4) &&
		memEq(info + 2, id + 8, 4);
}